

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

type __thiscall
chrono::ChValueSpecific<chrono::ChVector<double>>::_archive_out<chrono::ChVector<double>>
          (ChValueSpecific<chrono::ChVector<double>> *this,ChArchiveOut *marchive)

{
  ChArchiveOut *marchive_local;
  ChValueSpecific<chrono::ChVector<double>_> *this_local;
  
  ChVector<double>::ArchiveOUT(*(ChVector<double> **)(this + 0x30),marchive);
  return;
}

Assistant:

typename enable_if< ChDetect_ArchiveOUT<Tc>::value, void >::type
        _archive_out(ChArchiveOut& marchive) {
            this->_ptr_to_val->ArchiveOUT(marchive);
        }